

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.h
# Opt level: O0

int has_closest_ref_frames
              (MV_REFERENCE_FRAME *ref_frame,int8_t closest_past_ref,int8_t closest_future_ref)

{
  bool bVar1;
  bool bVar2;
  bool local_17;
  int has_closest_future_ref;
  int has_closest_past_ref;
  int8_t closest_future_ref_local;
  int8_t closest_past_ref_local;
  MV_REFERENCE_FRAME *ref_frame_local;
  
  bVar1 = true;
  if (*ref_frame != closest_past_ref) {
    bVar1 = ref_frame[1] == closest_past_ref;
  }
  bVar2 = true;
  if (*ref_frame != closest_future_ref) {
    bVar2 = ref_frame[1] == closest_future_ref;
  }
  local_17 = false;
  if (bVar1) {
    local_17 = bVar2;
  }
  return (int)local_17;
}

Assistant:

static inline int has_closest_ref_frames(const MV_REFERENCE_FRAME *ref_frame,
                                         int8_t closest_past_ref,
                                         int8_t closest_future_ref) {
  int has_closest_past_ref =
      (ref_frame[0] == closest_past_ref) || (ref_frame[1] == closest_past_ref);
  int has_closest_future_ref = (ref_frame[0] == closest_future_ref) ||
                               (ref_frame[1] == closest_future_ref);
  return (has_closest_past_ref && has_closest_future_ref);
}